

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O3

back_insert_iterator<std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>
 __thiscall
testing::internal::
TransformTupleValuesHelper<std::tuple<testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>_>,_testing::internal::CastAndAppendTransform<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::back_insert_iterator<std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>_>
::
IterateOverTuple<std::tuple<testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>_>,_3UL>
::operator()(undefined8 param_1,long param_2,
            vector<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>,std::allocator<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>>>
            *param_3)

{
  back_insert_iterator<std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>
  bVar1;
  MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&> local_30;
  
  PointeeMatcher::operator_cast_to_Matcher
            ((Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)&local_30,
             (PointeeMatcher *)(param_2 + 8));
  std::
  vector<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>,std::allocator<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>>>
  ::emplace_back<testing::Matcher<std::unique_ptr<int,std::default_delete<int>>const&>>
            (param_3,(Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&> *)&local_30);
  MatcherBase<const_std::unique_ptr<int,_std::default_delete<int>_>_&>::~MatcherBase(&local_30);
  bVar1 = IterateOverTuple<std::tuple<testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>_>,_2UL>
          ::operator()((IterateOverTuple<std::tuple<testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>,_testing::internal::PointeeMatcher<int>_>,_2UL>
                        *)&local_30,param_2,param_3);
  return (back_insert_iterator<std::vector<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>,_std::allocator<testing::Matcher<const_std::unique_ptr<int,_std::default_delete<int>_>_&>_>_>_>
          )bVar1.container;
}

Assistant:

OutIter operator()(Func f, const Tup& t, OutIter out) const {
      *out++ = f(::std::get<TupleSize::value - kRemainingSize>(t));
      return IterateOverTuple<Tup, kRemainingSize - 1>()(f, t, out);
    }